

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_script.c
# Opt level: O0

ngx_int_t ngx_http_complex_value
                    (ngx_http_request_t *r,ngx_http_complex_value_t *val,ngx_str_t *value)

{
  long lVar1;
  u_char *puVar2;
  long *local_98;
  ngx_http_script_engine_t e;
  ngx_http_script_len_code_pt lcode;
  ngx_http_script_code_pt code;
  size_t len;
  ngx_str_t *value_local;
  ngx_http_complex_value_t *val_local;
  ngx_http_request_t *r_local;
  
  if (val->lengths == (void *)0x0) {
    value->len = (val->value).len;
    value->data = (val->value).data;
    r_local = (ngx_http_request_t *)0x0;
  }
  else {
    ngx_http_script_flush_complex_value(r,val);
    memset(&local_98,0,0x58);
    local_98 = (long *)val->lengths;
    e.args._0_1_ = (byte)e.args & 0xfe | 1;
    code = (ngx_http_script_code_pt)0x0;
    e.status = (ngx_int_t)r;
    while (*local_98 != 0) {
      e.request = (ngx_http_request_t *)*local_98;
      lVar1 = (*(code *)e.request)(&local_98);
      code = code + lVar1;
    }
    value->len = (size_t)code;
    puVar2 = (u_char *)ngx_pnalloc(r->pool,(size_t)code);
    value->data = puVar2;
    if (value->data == (u_char *)0x0) {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
    else {
      local_98 = (long *)val->values;
      e.ip = value->data;
      e.sp = (ngx_http_variable_value_t *)value->len;
      e.buf.len = (size_t)value->data;
      while (*local_98 != 0) {
        (*(code *)*local_98)(&local_98);
      }
      value->len = (size_t)e.sp;
      value->data = (u_char *)e.buf.len;
      r_local = (ngx_http_request_t *)0x0;
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

ngx_int_t
ngx_http_complex_value(ngx_http_request_t *r, ngx_http_complex_value_t *val,
    ngx_str_t *value)
{
    size_t                        len;
    ngx_http_script_code_pt       code;
    ngx_http_script_len_code_pt   lcode;
    ngx_http_script_engine_t      e;

    if (val->lengths == NULL) {
        *value = val->value;
        return NGX_OK;
    }

    ngx_http_script_flush_complex_value(r, val);

    ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

    e.ip = val->lengths;
    e.request = r;
    e.flushed = 1;

    len = 0;

    while (*(uintptr_t *) e.ip) {
        lcode = *(ngx_http_script_len_code_pt *) e.ip;
        len += lcode(&e);
    }

    value->len = len;
    value->data = ngx_pnalloc(r->pool, len);
    if (value->data == NULL) {
        return NGX_ERROR;
    }

    e.ip = val->values;
    e.pos = value->data;
    e.buf = *value;

    while (*(uintptr_t *) e.ip) {
        code = *(ngx_http_script_code_pt *) e.ip;
        code((ngx_http_script_engine_t *) &e);
    }

    *value = e.buf;

    return NGX_OK;
}